

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iRpn.cpp
# Opt level: O2

void __thiscall Imaginer::Utils::iRpn::cut(iRpn *this)

{
  uint uVar1;
  RPNnode *pRVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  int end;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  iStack<Imaginer::Utils::iStack<Imaginer::Utils::iRpn::RPNnode>_> funList;
  iStack<Imaginer::Utils::iRpn::RPNnode> result;
  iStack<Imaginer::Utils::iStack<Imaginer::Utils::iRpn::RPNnode>_> local_68;
  iStack<Imaginer::Utils::iRpn::RPNnode> local_58;
  iRpn *local_48;
  iStack<Imaginer::Utils::iRpn::RPNnode> local_40;
  
  local_68._data._0_4_ = 0x400;
  iStack<Imaginer::Utils::iRpn::RPNnode>::iStack(&local_58,(int *)&local_68);
  local_40._data._0_4_ = 0x400;
  iStack<Imaginer::Utils::iStack<Imaginer::Utils::iRpn::RPNnode>_>::iStack
            (&local_68,(int *)&local_40);
  uVar1 = this->_operands->_top;
  uVar7 = 0;
  uVar6 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar6 = uVar7;
  }
  end = 0;
  local_48 = this;
  do {
    lVar5 = uVar7 * 0x10 + 0x18;
    lVar8 = 0;
    while( true ) {
      if (uVar7 - uVar6 == lVar8) {
        poVar4 = operator<<((ostream *)&std::cout,&local_68);
        std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = operator<<((ostream *)&std::cout,&local_58);
        std::endl<char,std::char_traits<char>>(poVar4);
        iStack<Imaginer::Utils::iStack<Imaginer::Utils::iRpn::RPNnode>_>::~iStack(&local_68);
        iStack<Imaginer::Utils::iRpn::RPNnode>::~iStack(&local_58);
        return;
      }
      pRVar2 = local_48->_operands->_data;
      if ((*(char *)((long)&pRVar2[-1]._node + lVar5) != '\0') &&
         (*(char *)((long)&pRVar2->_node + lVar5) == '\x01')) break;
      lVar8 = lVar8 + -1;
      lVar5 = lVar5 + 0x10;
    }
    iVar3 = (int)uVar7;
    iStack<Imaginer::Utils::iRpn::RPNnode>::cut(&local_40,(int)local_48->_operands,end);
    iStack<Imaginer::Utils::iRpn::RPNnode>::operator=(&local_58,&local_40);
    iStack<Imaginer::Utils::iRpn::RPNnode>::~iStack(&local_40);
    poVar4 = operator<<((ostream *)&std::cout,&local_58);
    std::endl<char,std::char_traits<char>>(poVar4);
    uVar7 = (uVar7 - lVar8) + 1;
    iStack<Imaginer::Utils::iStack<Imaginer::Utils::iRpn::RPNnode>_>::push(&local_68,&local_58);
    end = (end + iVar3) - (int)lVar8;
  } while( true );
}

Assistant:

void iRpn::cut()
{
    iStack<RPNnode> result;
    iStack< iStack<RPNnode> > funList;
    int size = _operands->size();
    int i = 0;
    int flag = 0;
    for(;i < size;++i)
    {
        if((*_operands)[i] && (*_operands)[i+1])
        {
            result = _operands->cut(flag,flag+i);
            flag += i;
            std::cout << result << std::endl;
            funList.push(result);
            continue;
        }
    }
    //funList = _operands->cut(0,i);
    //result  = _operands->copy();
    std::cout << funList << std::endl;
    std::cout << result << std::endl;
}